

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Recorder.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Recorder::AddPoint(ChFunction_Recorder *this,double mx,double my,double mw)

{
  const_iterator cVar1;
  double dVar2;
  const_iterator __position;
  list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_> *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChRecPoint rec;
  value_type local_18;
  
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  this_00 = &this->m_points;
  cVar1._M_node = (_List_node_base *)this_00;
  while( true ) {
    __position._M_node = cVar1._M_node;
    local_18.x = mx;
    local_18.y = my;
    local_18.w = mw;
    if (__position._M_node ==
        (this->m_points).super__List_base<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>.
        _M_impl._M_node.super__List_node_base._M_next) {
      std::__cxx11::list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>::push_front
                (this_00,&local_18);
      return;
    }
    cVar1._M_node = (__position._M_node)->_M_prev;
    dVar2 = mx - (double)cVar1._M_node[1]._M_next;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar2;
    auVar4 = vandpd_avx(auVar4,auVar3);
    if (auVar4._0_8_ < 2.220446049250313e-16) break;
    if (0.0 < dVar2) {
      std::__cxx11::list<chrono::ChRecPoint,_std::allocator<chrono::ChRecPoint>_>::insert
                (this_00,__position,&local_18);
      return;
    }
  }
  cVar1._M_node[1]._M_next = (_List_node_base *)mx;
  cVar1._M_node[1]._M_prev = (_List_node_base *)my;
  cVar1._M_node[2]._M_next = (_List_node_base *)mw;
  return;
}

Assistant:

void ChFunction_Recorder::AddPoint(double mx, double my, double mw) {
    for (auto iter = m_points.rbegin(); iter != m_points.rend(); ++iter) {
        double dist = mx - iter->x;
        if (std::abs(dist) < std::numeric_limits<double>::epsilon()) {
            // Overwrite current iterator
            iter->x = mx;
            iter->y = my;
            iter->w = mw;
            return;
        } else if (dist > 0) {
            // Insert before current iterator
            ChRecPoint rec(mx, my, mw);
            m_points.insert(iter.base(), rec);
            return;
        }
    }

    // Insert in front of list
    m_points.push_front(ChRecPoint(mx, my, mw));
}